

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O2

Vec_Int_t * Cbs_ManSolveMiter(Gia_Man_t *pAig,int nConfs,Vec_Str_t **pvStatus,int fVerbose)

{
  Vec_Int_t *vCex;
  abctime aVar1;
  Cbs0_Man_t *p;
  Vec_Str_t *p_00;
  char *pcVar2;
  Vec_Int_t *vCexStore;
  Vec_Int_t *p_01;
  abctime aVar3;
  abctime aVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  Gia_Obj_t *pGVar8;
  bool bVar9;
  
  aVar1 = Abc_Clock();
  if (pAig->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCSatOld.c"
                  ,0x2cd,"Vec_Int_t *Cbs_ManSolveMiter(Gia_Man_t *, int, Vec_Str_t **, int)");
  }
  Gia_ManCreateRefs(pAig);
  Gia_ManCleanMark0(pAig);
  Gia_ManCleanMark1(pAig);
  p = Cbs0_ManAlloc();
  (p->Pars).nBTLimit = nConfs;
  p->pAig = pAig;
  iVar6 = pAig->vCos->nSize - pAig->nRegs;
  p_00 = (Vec_Str_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar5;
  if (iVar5 == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (char *)malloc((long)iVar5);
  }
  p_00->pArray = pcVar2;
  vCexStore = Vec_IntAlloc(10000);
  p_01 = Vec_IntAlloc(100);
  vCex = p->vModel;
  for (lVar7 = 0; lVar7 < pAig->vCos->nSize; lVar7 = lVar7 + 1) {
    iVar5 = pAig->vCos->pArray[lVar7];
    if (((long)iVar5 < 0) || (pAig->nObjs <= iVar5)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
    pGVar8 = pAig->pObjs + iVar5;
    vCex->nSize = 0;
    iVar5 = (int)lVar7;
    if ((~*(ulong *)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff)) &
        0x1fffffff1fffffff) == 0) {
      bVar9 = ((uint)*(undefined8 *)pGVar8 >> 0x1d & 1) != 0;
      if (bVar9) {
        puts("Constant 1 output of SRM!!!");
        Cec_ManSatAddToStore(vCexStore,vCex,iVar5);
      }
      Vec_StrPush(p_00,!bVar9);
    }
    else {
      aVar3 = Abc_Clock();
      (p->Pars).fUseHighest = 1;
      (p->Pars).fUseLowest = 0;
      iVar6 = Cbs0_ManSolve(p,(Gia_Obj_t *)
                              ((ulong)((uint)*(undefined8 *)pGVar8 >> 0x1d & 1) ^
                              (ulong)(pGVar8 + -(ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff))))
      ;
      Vec_StrPush(p_00,(char)iVar6);
      if (iVar6 == 1) {
        p->nSatUnsat = p->nSatUnsat + 1;
        p->nConfUnsat = p->nConfUnsat + (p->Pars).nBTThis;
        aVar4 = Abc_Clock();
        p->timeSatUnsat = p->timeSatUnsat + (aVar4 - aVar3);
      }
      else if (iVar6 == -1) {
        p->nSatUndec = p->nSatUndec + 1;
        p->nConfUndec = p->nConfUndec + (p->Pars).nBTThis;
        Cec_ManSatAddToStore(vCexStore,(Vec_Int_t *)0x0,iVar5);
        aVar4 = Abc_Clock();
        p->timeSatUndec = p->timeSatUndec + (aVar4 - aVar3);
      }
      else {
        p->nSatSat = p->nSatSat + 1;
        p->nConfSat = p->nConfSat + (p->Pars).nBTThis;
        Cec_ManSatAddToStore(vCexStore,vCex,iVar5);
        aVar4 = Abc_Clock();
        p->timeSatSat = p->timeSatSat + (aVar4 - aVar3);
      }
    }
  }
  Vec_IntFree(p_01);
  p->nSatTotal = pAig->vCos->nSize - pAig->nRegs;
  aVar3 = Abc_Clock();
  p->timeTotal = aVar3 - aVar1;
  if (fVerbose != 0) {
    Cbs0_ManSatPrintStats(p);
  }
  Cbs0_ManStop(p);
  *pvStatus = p_00;
  return vCexStore;
}

Assistant:

Vec_Int_t * Cbs_ManSolveMiter( Gia_Man_t * pAig, int nConfs, Vec_Str_t ** pvStatus, int fVerbose )
{
    extern void Cec_ManSatAddToStore( Vec_Int_t * vCexStore, Vec_Int_t * vCex, int Out );
    Cbs0_Man_t * p; 
    Vec_Int_t * vCex, * vVisit, * vCexStore;
    Vec_Str_t * vStatus;
    Gia_Obj_t * pRoot; 
    int i, status;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) == 0 );
    // prepare AIG
    Gia_ManCreateRefs( pAig );
    Gia_ManCleanMark0( pAig );
    Gia_ManCleanMark1( pAig );
    // create logic network
    p = Cbs0_ManAlloc();
    p->Pars.nBTLimit = nConfs;
    p->pAig   = pAig;
    // create resulting data-structures
    vStatus   = Vec_StrAlloc( Gia_ManPoNum(pAig) );
    vCexStore = Vec_IntAlloc( 10000 );
    vVisit    = Vec_IntAlloc( 100 );
    vCex      = Cbs0_ReadModel( p );
    // solve for each output
    Gia_ManForEachCo( pAig, pRoot, i )
    {
        Vec_IntClear( vCex );
        if ( Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) )
        {
            if ( Gia_ObjFaninC0(pRoot) )
            {
                printf( "Constant 1 output of SRM!!!\n" );
                Cec_ManSatAddToStore( vCexStore, vCex, i ); // trivial counter-example
                Vec_StrPush( vStatus, 0 );
            }
            else
            {
//                printf( "Constant 0 output of SRM!!!\n" );
                Vec_StrPush( vStatus, 1 );
            }
            continue;
        }
        clk = Abc_Clock();
        p->Pars.fUseHighest = 1;
        p->Pars.fUseLowest  = 0;
        status = Cbs0_ManSolve( p, Gia_ObjChild0(pRoot) );
/*
        if ( status == -1 )
        {
            p->Pars.fUseHighest = 0;
            p->Pars.fUseLowest  = 1;
            status = Cbs0_ManSolve( p, Gia_ObjChild0(pRoot) );
        }
*/
        Vec_StrPush( vStatus, (char)status );
        if ( status == -1 )
        {
            p->nSatUndec++;
            p->nConfUndec += p->Pars.nBTThis;
            Cec_ManSatAddToStore( vCexStore, NULL, i ); // timeout
            p->timeSatUndec += Abc_Clock() - clk;
            continue;
        }
        if ( status == 1 )
        {
            p->nSatUnsat++;
            p->nConfUnsat += p->Pars.nBTThis;
            p->timeSatUnsat += Abc_Clock() - clk;
            continue;
        }
        p->nSatSat++;
        p->nConfSat += p->Pars.nBTThis;
//        Gia_SatVerifyPattern( pAig, pRoot, vCex, vVisit );
        Cec_ManSatAddToStore( vCexStore, vCex, i );
        p->timeSatSat += Abc_Clock() - clk;
    }
    Vec_IntFree( vVisit );
    p->nSatTotal = Gia_ManPoNum(pAig);
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Cbs0_ManSatPrintStats( p );
    Cbs0_ManStop( p );
    *pvStatus = vStatus;
//    printf( "Total number of cex literals = %d. (Ave = %d)\n", 
//         Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat, 
//        (Vec_IntSize(vCexStore)-2*p->nSatUndec-2*p->nSatSat)/p->nSatSat );
    return vCexStore;
}